

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

bool __thiscall QTreeViewPrivate::expandOrCollapseItemAtPos(QTreeViewPrivate *this,QPoint *pos)

{
  State SVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  int item;
  bool bVar5;
  long in_FS_OFFSET;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  SVar1 = (this->super_QAbstractItemViewPrivate).state;
  if ((SVar1 == EditingState) || (SVar1 == NoState)) {
    local_40 = QWidget::rect((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate
                             .viewport);
    cVar3 = QRect::contains((QPoint *)&local_40,SUB81(pos,0));
    bVar5 = true;
    if (cVar3 != '\0') {
      item = itemDecorationAt(this,pos);
      if ((item != -1) && (this->itemsExpandable == true)) {
        bVar4 = hasVisibleChildren(this,&(this->viewItems).d.ptr[item].index);
        if (bVar4) {
          if (((this->viewItems).d.ptr[item].field_0x1c & 1) == 0) {
            expand(this,item,true);
          }
          else {
            collapse(this,item,true);
          }
          if ((this->super_QAbstractItemViewPrivate).state != AnimatingState) {
            (**(code **)(*plVar2 + 0x268))(plVar2);
            QWidget::update((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                            viewport);
          }
          goto LAB_00541d55;
        }
      }
      bVar5 = false;
    }
  }
  else {
    bVar5 = true;
  }
LAB_00541d55:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QTreeViewPrivate::expandOrCollapseItemAtPos(const QPoint &pos)
{
    Q_Q(QTreeView);
    // we want to handle mousePress in EditingState (persistent editors)
    if ((state != QAbstractItemView::NoState
                && state != QAbstractItemView::EditingState)
                || !viewport->rect().contains(pos))
        return true;

    int i = itemDecorationAt(pos);
    if ((i != -1) && itemsExpandable && hasVisibleChildren(viewItems.at(i).index)) {
        if (viewItems.at(i).expanded)
            collapse(i, true);
        else
            expand(i, true);
        if (!isAnimating()) {
            q->updateGeometries();
            viewport->update();
        }
        return true;
    }
    return false;
}